

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH32_hash_t XXH32(void *input,size_t len,uint seed)

{
  U32 UVar1;
  uint uVar2;
  BYTE *pBVar3;
  XXH_endianess endian_detected;
  uint seed_local;
  size_t len_local;
  void *input_local;
  U32 v4_1;
  U32 v3_1;
  U32 v2_1;
  U32 v1_1;
  BYTE *limit_1;
  U32 h32_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  U32 local_148;
  U32 local_144;
  U32 v4;
  U32 v3;
  U32 v2;
  U32 v1;
  BYTE *limit;
  U32 h32;
  BYTE *bEnd;
  BYTE *p;
  
  pBVar3 = (BYTE *)((long)input + len);
  bEnd = (BYTE *)input;
  if (len < 0x10) {
    limit._4_4_ = seed + 0x165667b1;
  }
  else {
    v3 = seed + 0x24234428;
    v4 = seed + 0x85ebca77;
    local_148 = seed + 0x61c8864f;
    local_144 = seed;
    do {
      UVar1 = XXH_read32(bEnd);
      v3 = XXH32_round(v3,UVar1);
      UVar1 = XXH_read32(bEnd + 4);
      v4 = XXH32_round(v4,UVar1);
      UVar1 = XXH_read32(bEnd + 8);
      local_144 = XXH32_round(local_144,UVar1);
      UVar1 = XXH_read32(bEnd + 0xc);
      local_148 = XXH32_round(local_148,UVar1);
      bEnd = bEnd + 0x10;
    } while (bEnd <= pBVar3 + -0x10);
    limit._4_4_ = (v3 << 1 | v3 >> 0x1f) + (v4 << 7 | v4 >> 0x19) +
                  (local_144 << 0xc | local_144 >> 0x14) + (local_148 << 0x12 | local_148 >> 0xe);
  }
  limit._4_4_ = (int)len + limit._4_4_;
  for (; bEnd + 4 <= pBVar3; bEnd = bEnd + 4) {
    UVar1 = XXH_read32(bEnd);
    uVar2 = UVar1 * -0x3d4d51c3 + limit._4_4_;
    limit._4_4_ = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  }
  for (; bEnd < pBVar3; bEnd = bEnd + 1) {
    uVar2 = (uint)*bEnd * 0x165667b1 + limit._4_4_;
    limit._4_4_ = (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
  }
  uVar2 = (limit._4_4_ >> 0xf ^ limit._4_4_) * -0x7a143589;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51c3;
  return uVar2 >> 0x10 ^ uVar2;
}

Assistant:

XXH_PUBLIC_API unsigned int XXH32 (const void* input, size_t len, unsigned int seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH32_CREATESTATE_STATIC(state);
    XXH32_reset(state, seed);
    XXH32_update(state, input, len);
    return XXH32_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 3) == 0) {   /* Input is 4-bytes aligned, leverage the speed benefit */
            if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
                return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
            else
                return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }   }

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}